

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O1

void lj_wbuf_addn(lj_wbuf *buf,void *src,size_t n)

{
  uint8_t *puVar1;
  
  if ((buf->flags & 2) == 0) {
    puVar1 = (uint8_t *)buf->size;
    if (puVar1 < n) {
      do {
        puVar1 = puVar1 + ((long)buf->buf - (long)buf->pos);
        memcpy(buf->pos,src,(size_t)puVar1);
        buf->pos = buf->pos + (long)puVar1;
        lj_wbuf_flush(buf);
        src = (void *)((long)src + (long)puVar1);
        n = n + -(long)puVar1;
        puVar1 = (uint8_t *)buf->size;
      } while (puVar1 < n);
    }
    if (buf->buf + ((long)puVar1 - (long)buf->pos) < n) {
      lj_wbuf_flush(buf);
    }
    memcpy(buf->pos,src,n);
    buf->pos = buf->pos + n;
  }
  return;
}

Assistant:

void lj_wbuf_addn(struct lj_wbuf *buf, const void *src, size_t n)
{
  if (LJ_UNLIKELY(lj_wbuf_test_flag(buf, STREAM_STOP)))
    return;
  /*
  ** Very unlikely: We are told to write a large buffer at once.
  ** Buffer doesn't belong to us so we must to pump data
  ** through the buffer.
  */
  while (LJ_UNLIKELY(n > buf->size)) {
    const size_t left = wbuf_left(buf);
    memcpy(buf->pos, src, left);
    buf->pos += (ptrdiff_t)left;
    lj_wbuf_flush(buf);
    src = (uint8_t *)src + (ptrdiff_t)left;
    n -= left;
  }

  wbuf_reserve(buf, n);
  memcpy(buf->pos, src, n);
  buf->pos += (ptrdiff_t)n;
}